

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatcoe.c
# Opt level: O0

int ecx_SDOwrite(ecx_contextt *context,uint16 Slave,uint16 Index,uint8 SubIndex,boolean CA,int psize
                ,void *p,int Timeout)

{
  bool bVar1;
  uint8 uVar2;
  ushort uVar3;
  int iVar4;
  void *local_848;
  uint8 *hp;
  short local_838;
  uint8 uStack_836;
  boolean NotLast;
  uint16 framedatasize;
  uint8 toggle;
  uint8 cnt;
  ec_mbxbuft MbxOut;
  ec_mbxbuft MbxIn;
  int maxdata;
  int wkc;
  ec_SDOt *aSDOp;
  ec_SDOt *SDOp;
  int psize_local;
  boolean CA_local;
  uint8 SubIndex_local;
  uint16 Index_local;
  uint16 Slave_local;
  ecx_contextt *context_local;
  uint uVar5;
  
  ec_clearmbx((ec_mbxbuft *)(MbxOut + 0x3f8));
  ecx_mbxreceive(context,Slave,(ec_mbxbuft *)(MbxOut + 0x3f8),0);
  ec_clearmbx((ec_mbxbuft *)&local_838);
  uVar5 = (uint)context->slavelist[Slave].mbx_l;
  iVar4 = uVar5 - 0x10;
  if ((psize < 5) && (CA == '\0')) {
    local_838._0_1_ = '\n';
    local_838._1_1_ = '\0';
    uStack_836 = '\0';
    NotLast = '\0';
    framedatasize._0_1_ = 0;
    uVar2 = ec_nextmbxcnt(context->slavelist[Slave].mbx_cnt);
    context->slavelist[Slave].mbx_cnt = uVar2;
    framedatasize._1_1_ = uVar2 * '\x10' + '\x03';
    toggle = '\0';
    cnt = ' ';
    MbxOut[0] = (byte)((4U - psize & 3) << 2) | 0x23;
    MbxOut._1_2_ = Index;
    MbxOut[3] = SubIndex;
    memcpy(MbxOut + 4,p,(long)psize);
    MbxIn._1020_4_ = ecx_mbxsend(context,Slave,(ec_mbxbuft *)&local_838,20000);
    if (0 < (int)MbxIn._1020_4_) {
      ec_clearmbx((ec_mbxbuft *)(MbxOut + 0x3f8));
      MbxIn._1020_4_ = ecx_mbxreceive(context,Slave,(ec_mbxbuft *)(MbxOut + 0x3f8),Timeout);
      if ((0 < (int)MbxIn._1020_4_) &&
         ((((MbxOut[0x3fd] & 0xf) != 3 || ((int)(uint)(ushort)MbxOut._1022_2_ >> 0xc != 3)) ||
          ((MbxIn._1_2_ != MbxOut._1_2_ || (MbxIn[3] != MbxOut[3])))))) {
        if (MbxIn[0] == 0x80) {
          ecx_SDOerror(context,Slave,Index,SubIndex,MbxIn._4_4_);
        }
        else {
          ecx_packeterror(context,Slave,Index,SubIndex,1);
        }
        MbxIn[0x3fc] = '\0';
        MbxIn[0x3fd] = '\0';
        MbxIn[0x3fe] = '\0';
        MbxIn[0x3ff] = '\0';
      }
    }
  }
  else {
    hp._4_2_ = (ushort)psize;
    bVar1 = iVar4 < (int)(psize & 0xffffU);
    if (bVar1) {
      hp._4_2_ = (ushort)iVar4;
    }
    local_838 = hp._4_2_ + 10;
    uStack_836 = '\0';
    NotLast = '\0';
    framedatasize._0_1_ = 0;
    uVar2 = ec_nextmbxcnt(context->slavelist[Slave].mbx_cnt);
    context->slavelist[Slave].mbx_cnt = uVar2;
    framedatasize._1_1_ = uVar2 * '\x10' + '\x03';
    toggle = '\0';
    cnt = ' ';
    if (CA == '\0') {
      MbxOut[0] = '!';
    }
    else {
      MbxOut[0] = '1';
      if (1 < SubIndex) {
        MbxOut[3] = '\x01';
      }
    }
    MbxOut._4_4_ = psize;
    memcpy(MbxOut + 8,p,(ulong)hp._4_2_);
    local_848 = (void *)((long)p + (long)(int)(uint)hp._4_2_);
    SDOp._4_4_ = psize - (uint)hp._4_2_;
    MbxIn._1020_4_ = ecx_mbxsend(context,Slave,(ec_mbxbuft *)&local_838,20000);
    if (0 < (int)MbxIn._1020_4_) {
      ec_clearmbx((ec_mbxbuft *)(MbxOut + 0x3f8));
      MbxIn._1020_4_ = ecx_mbxreceive(context,Slave,(ec_mbxbuft *)(MbxOut + 0x3f8),Timeout);
      if (0 < (int)MbxIn._1020_4_) {
        if (((((MbxOut[0x3fd] & 0xf) == 3) && ((int)(uint)(ushort)MbxOut._1022_2_ >> 0xc == 3)) &&
            (MbxIn._1_2_ == MbxOut._1_2_)) && (MbxIn[3] == MbxOut[3])) {
          iVar4 = uVar5 - 9;
          hp._6_1_ = 0;
          while (bVar1) {
            uVar3 = (ushort)SDOp._4_4_;
            MbxOut[0] = '\x01';
            bVar1 = iVar4 < (int)(SDOp._4_4_ & 0xffff);
            if (bVar1) {
              uVar3 = (ushort)iVar4;
              MbxOut[0] = '\0';
LAB_00107c25:
              local_838 = uVar3 + 3;
            }
            else {
              if (6 < uVar3) goto LAB_00107c25;
              local_838 = 10;
              MbxOut[0] = ('\a' - (char)SDOp._4_4_) * '\x02' + '\x01';
            }
            uStack_836 = '\0';
            NotLast = '\0';
            framedatasize._0_1_ = 0;
            uVar2 = ec_nextmbxcnt(context->slavelist[Slave].mbx_cnt);
            context->slavelist[Slave].mbx_cnt = uVar2;
            framedatasize._1_1_ = uVar2 * '\x10' + '\x03';
            toggle = '\0';
            cnt = ' ';
            MbxOut[0] = MbxOut[0] + hp._6_1_;
            memcpy(MbxOut + 1,local_848,(ulong)uVar3);
            local_848 = (void *)((long)local_848 + (long)(int)(uint)uVar3);
            SDOp._4_4_ = SDOp._4_4_ - uVar3;
            MbxIn._1020_4_ = ecx_mbxsend(context,Slave,(ec_mbxbuft *)&local_838,20000);
            if (0 < (int)MbxIn._1020_4_) {
              ec_clearmbx((ec_mbxbuft *)(MbxOut + 0x3f8));
              MbxIn._1020_4_ = ecx_mbxreceive(context,Slave,(ec_mbxbuft *)(MbxOut + 0x3f8),Timeout);
              if ((0 < (int)MbxIn._1020_4_) &&
                 ((((MbxOut[0x3fd] & 0xf) != 3 || ((int)(uint)(ushort)MbxOut._1022_2_ >> 0xc != 3))
                  || ((MbxIn[0] & 0xe0) != 0x20)))) {
                if (MbxIn[0] == 0x80) {
                  ecx_SDOerror(context,Slave,Index,SubIndex,MbxIn._4_4_);
                }
                else {
                  ecx_packeterror(context,Slave,Index,SubIndex,1);
                }
                MbxIn[0x3fc] = '\0';
                MbxIn[0x3fd] = '\0';
                MbxIn[0x3fe] = '\0';
                MbxIn[0x3ff] = '\0';
                bVar1 = false;
              }
            }
            hp._6_1_ = hp._6_1_ ^ 0x10;
          }
        }
        else {
          if (MbxIn[0] == 0x80) {
            ecx_SDOerror(context,Slave,Index,SubIndex,MbxIn._4_4_);
          }
          else {
            ecx_packeterror(context,Slave,Index,SubIndex,1);
          }
          MbxIn[0x3fc] = '\0';
          MbxIn[0x3fd] = '\0';
          MbxIn[0x3fe] = '\0';
          MbxIn[0x3ff] = '\0';
        }
      }
    }
  }
  iVar4._0_1_ = MbxIn[0x3fc];
  iVar4._1_1_ = MbxIn[0x3fd];
  iVar4._2_1_ = MbxIn[0x3fe];
  iVar4._3_1_ = MbxIn[0x3ff];
  return iVar4;
}

Assistant:

int ecx_SDOwrite(ecx_contextt *context, uint16 Slave, uint16 Index, uint8 SubIndex,
                boolean CA, int psize, void *p, int Timeout)
{
   ec_SDOt *SDOp, *aSDOp;
   int wkc, maxdata;
   ec_mbxbuft MbxIn, MbxOut;
   uint8 cnt, toggle;
   uint16 framedatasize;
   boolean  NotLast;
   uint8 *hp;

   ec_clearmbx(&MbxIn);
   /* Empty slave out mailbox if something is in. Timout set to 0 */
   wkc = ecx_mbxreceive(context, Slave, (ec_mbxbuft *)&MbxIn, 0);
   ec_clearmbx(&MbxOut);
   aSDOp = (ec_SDOt *)&MbxIn;
   SDOp = (ec_SDOt *)&MbxOut;
   maxdata = context->slavelist[Slave].mbx_l - 0x10; /* data section=mailbox size - 6 mbx - 2 CoE - 8 sdo req */
   /* if small data use expedited transfer */
   if ((psize <= 4) && !CA)
   {
      SDOp->MbxHeader.length = htoes(0x000a);
      SDOp->MbxHeader.address = htoes(0x0000);
      SDOp->MbxHeader.priority = 0x00;
      /* get new mailbox counter, used for session handle */
      cnt = ec_nextmbxcnt(context->slavelist[Slave].mbx_cnt);
      context->slavelist[Slave].mbx_cnt = cnt;
      SDOp->MbxHeader.mbxtype = ECT_MBXT_COE + (cnt << 4); /* CoE */
      SDOp->CANOpen = htoes(0x000 + (ECT_COES_SDOREQ << 12)); /* number 9bits service upper 4 bits */
      SDOp->Command = ECT_SDO_DOWN_EXP | (((4 - psize) << 2) & 0x0c); /* expedited SDO download transfer */
      SDOp->Index = htoes(Index);
      SDOp->SubIndex = SubIndex;
      hp = p;
      /* copy parameter data to mailbox */
      memcpy(&SDOp->ldata[0], hp, psize);
      /* send mailbox SDO download request to slave */
      wkc = ecx_mbxsend(context, Slave, (ec_mbxbuft *)&MbxOut, EC_TIMEOUTTXM);
      if (wkc > 0)
      {
         ec_clearmbx(&MbxIn);
         /* read slave response */
         wkc = ecx_mbxreceive(context, Slave, (ec_mbxbuft *)&MbxIn, Timeout);
         if (wkc > 0)
         {
            /* response should be CoE, SDO response, correct index and subindex */
            if (((aSDOp->MbxHeader.mbxtype & 0x0f) == ECT_MBXT_COE) && 
                ((etohs(aSDOp->CANOpen) >> 12) == ECT_COES_SDORES) &&
                 (aSDOp->Index == SDOp->Index) &&
                 (aSDOp->SubIndex == SDOp->SubIndex))
            {
                 /* all OK */
            }
            /* unexpected response from slave */
            else
            {
               if (aSDOp->Command == ECT_SDO_ABORT) /* SDO abort frame received */
               {
                  ecx_SDOerror(context, Slave, Index, SubIndex, etohl(aSDOp->ldata[0]));
               }
               else
               {
                  ecx_packeterror(context, Slave, Index, SubIndex, 1); /* Unexpected frame returned */
               }
               wkc = 0;
            }
         }
      }
   }
   else
   {
      framedatasize = psize;
      NotLast = FALSE;
      if (framedatasize > maxdata)
      {
         framedatasize = maxdata;  /*  segmented transfer needed  */
         NotLast = TRUE;
      }
      SDOp->MbxHeader.length = htoes(0x0a + framedatasize);
      SDOp->MbxHeader.address = htoes(0x0000);
      SDOp->MbxHeader.priority = 0x00;
      /* get new mailbox counter, used for session handle */
      cnt = ec_nextmbxcnt(context->slavelist[Slave].mbx_cnt);
      context->slavelist[Slave].mbx_cnt = cnt;
      SDOp->MbxHeader.mbxtype = ECT_MBXT_COE + (cnt << 4); /* CoE */
      SDOp->CANOpen = htoes(0x000 + (ECT_COES_SDOREQ << 12)); /* number 9bits service upper 4 bits */
      if (CA)
      {
         SDOp->Command = ECT_SDO_DOWN_INIT_CA; /* Complete Access, normal SDO init download transfer */
      }
      else
      {
         SDOp->Command = ECT_SDO_DOWN_INIT; /* normal SDO init download transfer */
      }
      SDOp->Index = htoes(Index);
      SDOp->SubIndex = SubIndex;
      if (CA && (SubIndex > 1))
      {
         SDOp->SubIndex = 1;
      }
      SDOp->ldata[0] = htoel(psize);
      hp = p;
      /* copy parameter data to mailbox */
      memcpy(&SDOp->ldata[1], hp, framedatasize);
      hp += framedatasize;
      psize -= framedatasize;
      /* send mailbox SDO download request to slave */
      wkc = ecx_mbxsend(context, Slave, (ec_mbxbuft *)&MbxOut, EC_TIMEOUTTXM);
      if (wkc > 0)
      {
         ec_clearmbx(&MbxIn);
         /* read slave response */
         wkc = ecx_mbxreceive(context, Slave, (ec_mbxbuft *)&MbxIn, Timeout);
         if (wkc > 0)
         {
            /* response should be CoE, SDO response, correct index and subindex */
            if (((aSDOp->MbxHeader.mbxtype & 0x0f) == ECT_MBXT_COE) && 
                ((etohs(aSDOp->CANOpen) >> 12) == ECT_COES_SDORES) &&
                 (aSDOp->Index == SDOp->Index) &&
                 (aSDOp->SubIndex == SDOp->SubIndex))
            {
               /* all ok */
               maxdata += 7;
               toggle = 0;
               /* repeat while segments left */
               while (NotLast)
               {
                  SDOp = (ec_SDOt *)&MbxOut;
                  framedatasize = psize;
                  NotLast = FALSE;
                  SDOp->Command = 0x01; /* last segment */
                  if (framedatasize > maxdata)
                  {
                     framedatasize = maxdata;  /*  more segments needed  */
                     NotLast = TRUE;
                     SDOp->Command = 0x00; /* segments follow */
                  }
                  if (!NotLast && (framedatasize < 7))
                  {
                     SDOp->MbxHeader.length = htoes(0x0a); /* minimum size */
                     SDOp->Command = 0x01 + ((7 - framedatasize) << 1); /* last segment reduced octets */
                  }
                  else
                  {
                     SDOp->MbxHeader.length = htoes(framedatasize + 3); /* data + 2 CoE + 1 SDO */
                  }
                  SDOp->MbxHeader.address = htoes(0x0000);
                  SDOp->MbxHeader.priority = 0x00;
                  /* get new mailbox counter value */
                  cnt = ec_nextmbxcnt(context->slavelist[Slave].mbx_cnt);
                  context->slavelist[Slave].mbx_cnt = cnt;
                  SDOp->MbxHeader.mbxtype = ECT_MBXT_COE + (cnt << 4); /* CoE */
                  SDOp->CANOpen = htoes(0x000 + (ECT_COES_SDOREQ << 12)); /* number 9bits service upper 4 bits (SDO request) */
                  SDOp->Command = SDOp->Command + toggle; /* add toggle bit to command byte */
                  /* copy parameter data to mailbox */
                  memcpy(&SDOp->Index, hp, framedatasize);
                  /* update parameter buffer pointer */
                  hp += framedatasize;
                  psize -= framedatasize;
                  /* send SDO download request */
                  wkc = ecx_mbxsend(context, Slave, (ec_mbxbuft *)&MbxOut, EC_TIMEOUTTXM);
                  if (wkc > 0)
                  {
                     ec_clearmbx(&MbxIn);
                     /* read slave response */
                     wkc = ecx_mbxreceive(context, Slave, (ec_mbxbuft *)&MbxIn, Timeout);
                     if (wkc > 0)
                     {
                        if (((aSDOp->MbxHeader.mbxtype & 0x0f) == ECT_MBXT_COE) &&
                            ((etohs(aSDOp->CANOpen) >> 12) == ECT_COES_SDORES) &&
                            ((aSDOp->Command & 0xe0) == 0x20))
                        {
                                   /* all OK, nothing to do */
                        }
                        else
                        {
                           if (aSDOp->Command == ECT_SDO_ABORT) /* SDO abort frame received */
                           {
                              ecx_SDOerror(context, Slave, Index, SubIndex, etohl(aSDOp->ldata[0]));
                           }
                           else
                           {
                              ecx_packeterror(context, Slave, Index, SubIndex, 1); /* Unexpected frame returned */
                           }
                           wkc = 0;
                           NotLast = FALSE;
                        }
                     }
                  }
                  toggle = toggle ^ 0x10; /* toggle bit for segment request */
               }
            }
            /* unexpected response from slave */
            else
            {
               if (aSDOp->Command == ECT_SDO_ABORT) /* SDO abort frame received */
               {
                  ecx_SDOerror(context, Slave, Index, SubIndex, etohl(aSDOp->ldata[0]));
               }
               else
               {
                  ecx_packeterror(context, Slave, Index, SubIndex, 1); /* Unexpected frame returned */
               }
               wkc = 0;
            }
         }
      }
   }

   return wkc;
}